

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O2

void GetCompileDefinitionsAndDirectories
               (cmGeneratorTarget *target,string *config,string *incs,string *defs)

{
  cmLocalGenerator *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeDirs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  allocator local_89;
  string local_88;
  undefined1 local_60 [32];
  _Base_ptr local_40;
  size_t local_38;
  
  this = cmGeneratorTarget::GetLocalGenerator(target);
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string((string *)local_60,"CXX",&local_89);
  cmLocalGenerator::GetIncludeDirectories
            (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88,target,(string *)local_60,config,false);
  std::__cxx11::string::~string((string *)local_60);
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((string *)local_60,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_88,";");
  std::__cxx11::string::operator=((string *)incs,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
  local_60._24_8_ = local_60 + 8;
  local_60._8_4_ = _S_red;
  local_60._16_8_ = 0;
  local_38 = 0;
  local_40 = (_Base_ptr)local_60._24_8_;
  std::__cxx11::string::string((string *)&local_88,"CXX",&local_89);
  cmLocalGenerator::AddCompileDefinitions
            (this,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_60,target,config,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
            (&local_88,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,";");
  std::__cxx11::string::append((string *)defs);
  std::__cxx11::string::~string((string *)&local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
  return;
}

Assistant:

static void GetCompileDefinitionsAndDirectories(
  cmGeneratorTarget const* target, const std::string& config,
  std::string& incs, std::string& defs)
{
  cmLocalGenerator* localGen = target->GetLocalGenerator();
  {
    std::vector<std::string> includeDirs;
    // Get the include dirs for this target, without stripping the implicit
    // include dirs off, see
    // https://gitlab.kitware.com/cmake/cmake/issues/13667
    localGen->GetIncludeDirectories(includeDirs, target, "CXX", config, false);
    incs = cmJoin(includeDirs, ";");
  }
  {
    std::set<std::string> defines;
    localGen->AddCompileDefinitions(defines, target, config, "CXX");
    defs += cmJoin(defines, ";");
  }
}